

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeIteratorPrototype
               (DynamicObject *iteratorPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  undefined8 in_RAX;
  RuntimeFunction *pRVar1;
  uint uVar2;
  
  uVar2 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,iteratorPrototype,mode,1,0);
  pRVar1 = DefaultCreateFunction
                     ((((iteratorPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).
                      ptr,(FunctionInfo *)JavascriptIterator::EntryInfo::SymbolIterator,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x2c5);
  (*(iteratorPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(iteratorPrototype,0x14,pRVar1,6,0,0,(ulong)uVar2 << 0x20);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeIteratorPrototype(DynamicObject* iteratorPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(iteratorPrototype, mode, 1);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterIterator
        // so that the update is in sync with profiler

        JavascriptLibrary* library = iteratorPrototype->GetLibrary();

        library->AddFunctionToLibraryObjectWithName(iteratorPrototype, PropertyIds::_symbolIterator, PropertyIds::_RuntimeFunctionNameId_iterator,
            &JavascriptIterator::EntryInfo::SymbolIterator, 0);

        return true;
    }